

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

JBTIndex __thiscall
anon_unknown.dwarf_ab3c04::BacktraceData::Add(BacktraceData *this,cmListFileBacktrace *bt)

{
  bool bVar1;
  ArrayIndex AVar2;
  pointer ppVar3;
  Value *pVVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  Value local_128;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_100;
  ArrayIndex local_ec;
  undefined1 local_e8 [4];
  JBTIndex parent;
  Value local_c0;
  Value local_88;
  undefined1 local_60 [8];
  Value entry;
  _Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false> local_30;
  iterator found;
  cmListFileContext *top;
  cmListFileBacktrace *bt_local;
  BacktraceData *this_local;
  JBTIndex index;
  
  JBTIndex::JBTIndex((JBTIndex *)((long)&this_local + 4));
  bVar1 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                    (&bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
  if (!bVar1) {
    found.super__Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>.
    _M_cur = (_Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>)
             cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                       (&bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<const_cmListFileContext_*,_unsigned_int,_std::hash<const_cmListFileContext_*>,_std::equal_to<const_cmListFileContext_*>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>_>
         ::find(&this->NodeMap,(key_type *)&found);
    entry.limit_ = (ptrdiff_t)
                   std::
                   unordered_map<const_cmListFileContext_*,_unsigned_int,_std::hash<const_cmListFileContext_*>,_std::equal_to<const_cmListFileContext_*>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>_>
                   ::end(&this->NodeMap);
    bVar1 = std::__detail::operator!=
                      (&local_30,
                       (_Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>
                        *)&entry.limit_);
    if (bVar1) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false,_false>
                             *)&local_30);
      this_local._4_4_ = ppVar3->second;
    }
    else {
      Json::Value::Value((Value *)local_60,objectValue);
      AVar2 = AddFile(this,(string *)
                           ((long)found.
                                  super__Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>
                                  ._M_cur + 0x20));
      Json::Value::Value(&local_88,AVar2);
      pVVar4 = Json::Value::operator[]((Value *)local_60,"file");
      Json::Value::operator=(pVVar4,&local_88);
      Json::Value::~Value(&local_88);
      if (*(long *)((long)found.
                          super__Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>
                          ._M_cur + 0x40) != 0) {
        Json::Value::Value(&local_c0,
                           *(Int *)((long)found.
                                          super__Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>
                                          ._M_cur + 0x40));
        pVVar4 = Json::Value::operator[]((Value *)local_60,"line");
        Json::Value::operator=(pVVar4,&local_c0);
        Json::Value::~Value(&local_c0);
      }
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        AVar2 = AddCommand(this,(string *)
                                found.
                                super__Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>
                                ._M_cur);
        Json::Value::Value((Value *)local_e8,AVar2);
        pVVar4 = Json::Value::operator[]((Value *)local_60,"command");
        Json::Value::operator=(pVVar4,(Value *)local_e8);
        Json::Value::~Value((Value *)local_e8);
      }
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::Pop(&local_100);
      local_ec = (ArrayIndex)Add(this,(cmListFileBacktrace *)&local_100);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_100);
      bVar1 = (anonymous_namespace)::JBTIndex::operator_cast_to_bool((JBTIndex *)&local_ec);
      if (bVar1) {
        Json::Value::Value(&local_128,local_ec);
        pVVar4 = Json::Value::operator[]((Value *)local_60,"parent");
        Json::Value::operator=(pVVar4,&local_128);
        Json::Value::~Value(&local_128);
      }
      AVar2 = Json::Value::size(&this->Nodes);
      pmVar6 = std::
               unordered_map<const_cmListFileContext_*,_unsigned_int,_std::hash<const_cmListFileContext_*>,_std::equal_to<const_cmListFileContext_*>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>_>
               ::operator[](&this->NodeMap,(key_type *)&found);
      *pmVar6 = AVar2;
      this_local._4_4_ = AVar2;
      Json::Value::append(&this->Nodes,(Value *)local_60);
      Json::Value::~Value((Value *)local_60);
    }
  }
  return (JBTIndex)this_local._4_4_;
}

Assistant:

JBTIndex BacktraceData::Add(cmListFileBacktrace const& bt)
{
  JBTIndex index;
  if (bt.Empty()) {
    return index;
  }
  cmListFileContext const* top = &bt.Top();
  auto found = this->NodeMap.find(top);
  if (found != this->NodeMap.end()) {
    index.Index = found->second;
    return index;
  }
  Json::Value entry = Json::objectValue;
  entry["file"] = this->AddFile(top->FilePath);
  if (top->Line) {
    entry["line"] = static_cast<int>(top->Line);
  }
  if (!top->Name.empty()) {
    entry["command"] = this->AddCommand(top->Name);
  }
  if (JBTIndex parent = this->Add(bt.Pop())) {
    entry["parent"] = parent.Index;
  }
  index.Index = this->NodeMap[top] = this->Nodes.size();
  this->Nodes.append(std::move(entry)); // NOLINT(*)
  return index;
}